

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

void unzip(char *fn)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  la_int64_t lVar4;
  int acret_4;
  int acret_3;
  int acret_2;
  int acret_1;
  int acret;
  uintmax_t error_count;
  uintmax_t file_count;
  uintmax_t total_size;
  archive_entry *paStack_20;
  int ret;
  archive_entry *e;
  archive *a;
  char *fn_local;
  
  a = (archive *)fn;
  e = (archive_entry *)archive_read_new();
  if (e == (archive_entry *)0x0) {
    error("archive_read_new failed");
  }
  wVar1 = archive_read_support_format_zip((archive *)e);
  if (wVar1 != L'\0') {
    pcVar3 = archive_error_string((archive *)e);
    errorx("%s",pcVar3);
  }
  if ((O_arg != (char *)0x0) &&
     (wVar1 = archive_read_set_format_option((archive *)e,"zip","hdrcharset",O_arg), wVar1 != L'\0')
     ) {
    pcVar3 = archive_error_string((archive *)e);
    errorx("%s",pcVar3);
  }
  if (P_arg == (char *)0x0) {
    archive_read_set_passphrase_callback((archive *)e,(void *)0x0,passphrase_callback);
  }
  else {
    archive_read_add_passphrase((archive *)e,P_arg);
  }
  wVar1 = archive_read_open_filename((archive *)e,(char *)a,0x2000);
  if (wVar1 != L'\0') {
    pcVar3 = archive_error_string((archive *)e);
    errorx("%s",pcVar3);
  }
  if (zipinfo_mode == 0) {
    if ((p_opt == 0) && (q_opt == 0)) {
      printf("Archive:  %s\n",a);
    }
    if (v_opt == 1) {
      printf("  Length     %sDate   Time    Name\n",y_str);
      printf(" --------    %s----   ----    ----\n",y_str);
    }
    else if (v_opt == 2) {
      printf(" Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n",y_str);
      printf("--------  ------  ------- -----   %s----   ----   ------    ----\n",y_str);
    }
  }
  file_count = 0;
  error_count = 0;
  _acret_1 = 0;
  while (iVar2 = archive_read_next_header((archive *)e,&stack0xffffffffffffffe0), iVar2 != 1) {
    if (iVar2 != 0) {
      pcVar3 = archive_error_string((archive *)e);
      errorx("%s",pcVar3);
    }
    if (zipinfo_mode == 0) {
      if (t_opt == 0) {
        if (v_opt == 0) {
          if ((p_opt == 0) && (c_opt == 0)) {
            extract((archive *)e,paStack_20);
          }
          else {
            extract_stdout((archive *)e,paStack_20);
          }
        }
        else {
          list((archive *)e,paStack_20);
        }
      }
      else {
        iVar2 = test((archive *)e,paStack_20);
        _acret_1 = iVar2 + _acret_1;
      }
    }
    else if (Z1_opt != 0) {
      list((archive *)e,paStack_20);
    }
    lVar4 = archive_entry_size(paStack_20);
    file_count = lVar4 + file_count;
    error_count = error_count + 1;
  }
  if (zipinfo_mode != 0) {
    if (v_opt == 1) {
      printf(" --------                   %s-------\n",y_str);
      pcVar3 = "";
      if (error_count != 1) {
        pcVar3 = "s";
      }
      printf(" %8ju                   %s%ju file%s\n",file_count,y_str,error_count,pcVar3);
    }
    else if (v_opt == 2) {
      printf("--------          -------  ---                            %s-------\n",y_str);
      pcVar3 = "";
      if (error_count != 1) {
        pcVar3 = "s";
      }
      printf("%8ju          %7ju   0%%                            %s%ju file%s\n",file_count,
             file_count,y_str,error_count,pcVar3);
    }
  }
  iVar2 = archive_read_free((archive *)e);
  if (iVar2 != 0) {
    archive_error_string((archive *)e);
    errorx("%s");
  }
  if (passphrase_buf != (char *)0x0) {
    memset(passphrase_buf,0,0x400);
    free(passphrase_buf);
  }
  if (t_opt != 0) {
    if (_acret_1 == 0) {
      printf("No errors detected in compressed data of %s.\n",a);
    }
    else {
      errorx("%ju checksum error(s) found.",_acret_1);
    }
  }
  return;
}

Assistant:

static void
unzip(const char *fn)
{
	struct archive *a;
	struct archive_entry *e;
	int ret;
	uintmax_t total_size, file_count, error_count;

	if ((a = archive_read_new()) == NULL)
		error("archive_read_new failed");

	ac(archive_read_support_format_zip(a));

	if (O_arg)
		ac(archive_read_set_format_option(a, "zip", "hdrcharset", O_arg));

	if (P_arg)
		archive_read_add_passphrase(a, P_arg);
	else
		archive_read_set_passphrase_callback(a, NULL,
			&passphrase_callback);

	ac(archive_read_open_filename(a, fn, 8192));

	if (!zipinfo_mode) {
		if (!p_opt && !q_opt)
			printf("Archive:  %s\n", fn);
		if (v_opt == 1) {
			printf("  Length     %sDate   Time    Name\n", y_str);
			printf(" --------    %s----   ----    ----\n", y_str);
		} else if (v_opt == 2) {
			printf(" Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n", y_str);
			printf("--------  ------  ------- -----   %s----   ----   ------    ----\n", y_str);
		}
	}

	total_size = 0;
	file_count = 0;
	error_count = 0;
	for (;;) {
		ret = archive_read_next_header(a, &e);
		if (ret == ARCHIVE_EOF)
			break;
		ac(ret);
		if (!zipinfo_mode) {
			if (t_opt)
				error_count += test(a, e);
			else if (v_opt)
				list(a, e);
			else if (p_opt || c_opt)
				extract_stdout(a, e);
			else
				extract(a, e);
		} else {
			if (Z1_opt)
				list(a, e);
		}

		total_size += archive_entry_size(e);
		++file_count;
	}

	if (zipinfo_mode) {
		if (v_opt == 1) {
			printf(" --------                   %s-------\n", y_str);
			printf(" %8ju                   %s%ju file%s\n",
			    total_size, y_str, file_count, file_count != 1 ? "s" : "");
		} else if (v_opt == 2) {
			printf("--------          -------  ---                            %s-------\n", y_str);
			printf("%8ju          %7ju   0%%                            %s%ju file%s\n",
			    total_size, total_size, y_str, file_count,
			    file_count != 1 ? "s" : "");
		}
	}

	ac(archive_read_free(a));

	if (passphrase_buf != NULL) {
		memset(passphrase_buf, 0, PPBUFF_SIZE);
		free(passphrase_buf);
	}

	if (t_opt) {
		if (error_count > 0) {
			errorx("%ju checksum error(s) found.", error_count);
		}
		else {
			printf("No errors detected in compressed data of %s.\n",
			       fn);
		}
	}
}